

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint __thiscall ON_MeshComponentRef::VertexIndex(ON_MeshComponentRef *this)

{
  TYPE TVar1;
  ON_Mesh *pOVar2;
  uint uVar3;
  uint uVar4;
  ON_MeshTopologyVertex *topv;
  ON_3dPoint point;
  ON_MeshTopologyVertex *local_38;
  ON_3dPoint local_30;
  
  pOVar2 = this->m_mesh;
  if (pOVar2 == (ON_Mesh *)0x0) {
    return 0xffffffff;
  }
  uVar3 = (this->m_mesh_ci).m_index;
  if ((int)uVar3 < 0) {
    return 0xffffffff;
  }
  TVar1 = (this->m_mesh_ci).m_type;
  if (TVar1 != mesh_vertex) {
    if (TVar1 != meshtop_vertex) {
      return 0xffffffff;
    }
    GetMeshTopologyVertexAndPoint(this,&local_38,&local_30);
    if (local_38 == (ON_MeshTopologyVertex *)0x0) {
      return 0xffffffff;
    }
    if (local_38->m_v_count != 1) {
      return 0xffffffff;
    }
    if ((uint *)local_38->m_vi == (uint *)0x0) {
      return 0xffffffff;
    }
    uVar3 = *local_38->m_vi;
    pOVar2 = this->m_mesh;
  }
  uVar4 = 0xffffffff;
  if (uVar3 < (uint)(pOVar2->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

unsigned int ON_MeshComponentRef::VertexIndex() const
{
  unsigned int vi = ON_UNSET_UINT_INDEX;
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    switch(m_mesh_ci.m_type)
    {
    case ON_COMPONENT_INDEX::meshtop_vertex:
      {
        const struct ON_MeshTopologyVertex* v = MeshTopologyVertex();
        if ( 0 != v && 1 == v->m_v_count && 0 != v->m_vi 
             && ((unsigned int)v->m_vi[0]) < m_mesh->m_V.UnsignedCount()
           )
        {
          vi = (unsigned int)v->m_vi[0];
        }
      }
      break;

    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( ((unsigned int)m_mesh_ci.m_index) < m_mesh->m_V.UnsignedCount() )
        vi = (unsigned int)m_mesh_ci.m_index;
      break;
    
    default:
      break;
    }
  }
  return vi;
}